

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O2

bool google::protobuf::compiler::objectivec::anon_unknown_0::MessageContainsEnums
               (Descriptor *message)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  if (*(int *)(message + 0x74) < 1) {
    uVar1 = *(uint *)(message + 0x70);
    lVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar3 = 0;
    do {
      if (uVar5 == uVar3) {
        return (long)uVar3 < (long)(int)uVar1;
      }
      bVar2 = MessageContainsEnums((Descriptor *)(*(long *)(message + 0x38) + lVar4));
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x88;
    } while (!bVar2);
  }
  return true;
}

Assistant:

bool MessageContainsEnums(const Descriptor* message) {
  if (message->enum_type_count() > 0) {
    return true;
  }
  for (int i = 0; i < message->nested_type_count(); i++) {
    if (MessageContainsEnums(message->nested_type(i))) {
      return true;
    }
  }
  return false;
}